

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unicodeUtf8.c
# Opt level: O0

int decodeUtf8(uint8_t *bytePtr,uint32_t length)

{
  uint local_24;
  uint local_20;
  uint32_t remainingBytes;
  int value;
  uint32_t length_local;
  uint8_t *bytePtr_local;
  
  if (*bytePtr < 0x80) {
    bytePtr_local._4_4_ = (uint)*bytePtr;
  }
  else {
    if ((*bytePtr & 0xe0) == 0xc0) {
      local_20 = *bytePtr & 0x1f;
      local_24 = 1;
    }
    else if ((*bytePtr & 0xf0) == 0xe0) {
      local_20 = *bytePtr & 0xf;
      local_24 = 2;
    }
    else {
      if ((*bytePtr & 0xf8) != 0xf0) {
        return -1;
      }
      local_20 = *bytePtr & 7;
      local_24 = 3;
    }
    _value = bytePtr;
    if (length - 1 < local_24) {
      bytePtr_local._4_4_ = 0xffffffff;
    }
    else {
      while (local_24 != 0) {
        _value = _value + 1;
        local_24 = local_24 - 1;
        if ((*_value & 0xc0) != 0x80) {
          return -1;
        }
        local_20 = local_20 << 6 | *_value & 0x3f;
      }
      bytePtr_local._4_4_ = local_20;
    }
  }
  return bytePtr_local._4_4_;
}

Assistant:

int decodeUtf8(const uint8_t *bytePtr, uint32_t length) {
    //若是1字节的ascii:  0xxxxxxx
    if (*bytePtr <= 0x7f) {
        return *bytePtr;
    }

    int value;
    uint32_t remainingBytes;

    // 先读取高1字节
    // 根据高字节的高n位判断相应字节数的utf8编码
    if ((*bytePtr & 0xe0) == 0xc0) {
        //若是2字节的utf8
        value = *bytePtr & 0x1f;
        remainingBytes = 1;
    } else if ((*bytePtr & 0xf0) == 0xe0) {
        // 若是3字节的utf8
        value = *bytePtr & 0x0f;
        remainingBytes = 2;
    } else if ((*bytePtr & 0xf8) == 0xf0) {
        // 若是4字节的utf8
        value = *bytePtr & 0x07;
        remainingBytes = 3;
    } else {   // 非法编码
        return -1;
    }

    // 如果utf8被斩断了就不再读过去了
    if (remainingBytes > length - 1) {
        return -1;
    }

    // 再读取低字节中的数据
    while (remainingBytes > 0) {
        bytePtr++;
        remainingBytes--;
        //高2位必须是10
        if ((*bytePtr & 0xc0) != 0x80) {
            return -1;
        }

        // 从次高字节往低字节,不断累加各字节的低6位
        value = value << 6 | (*bytePtr & 0x3f);
    }
    return value;
}